

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAddr.cpp
# Opt level: O1

Error __thiscall
llvm::DWARFDebugAddrTable::extract
          (DWARFDebugAddrTable *this,DWARFDataExtractor Data,uint64_t *OffsetPtr,uint16_t Version,
          uint8_t AddrSize,function<void_(llvm::Error)> *WarnCallback)

{
  unsigned_long *Vals_1;
  ulong *Vals_1_00;
  byte bVar1;
  ulong uVar2;
  iterator iVar3;
  bool bVar4;
  DWARFDebugAddrTable *pDVar5;
  uint8_t uVar6;
  uint16_t uVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  char *pcVar10;
  uint uVar11;
  undefined7 in_register_00000009;
  char *pcVar12;
  undefined6 in_register_00000012;
  uint64_t *offset_ptr;
  error_category *peVar13;
  byte *Vals_2;
  long in_R9;
  ushort uVar14;
  uint uVar15;
  bool bVar16;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  error_code EC_03;
  error_code EC_04;
  error_code EC_05;
  error_code EC_06;
  error_code EC_07;
  ulong local_58;
  byte *local_50;
  ulong local_48;
  uint32_t TmpLength;
  ushort local_34;
  char local_32;
  byte local_31;
  uint16_t UnitVersion;
  uint8_t AddrSize_local;
  
  offset_ptr = (uint64_t *)CONCAT62(in_register_00000012,Version);
  uVar14 = (ushort)CONCAT71(in_register_00000009,AddrSize);
  local_31 = (byte)WarnCallback;
  OffsetPtr[2] = 0x500000000;
  if (OffsetPtr[5] != OffsetPtr[4]) {
    OffsetPtr[5] = OffsetPtr[4];
  }
  *(undefined4 *)(OffsetPtr + 2) = 0;
  OffsetPtr[1] = *offset_ptr;
  if ((*offset_ptr < 0xfffffffffffffffc) && (*offset_ptr + 3 < Data.super_DataExtractor.Data.Length)
     ) {
    if (uVar14 == 0) {
      pcVar10 = (char *)std::_V2::generic_category();
      EC._M_cat = (error_category *)0x16;
      EC._0_8_ = &local_58;
      createStringError(EC,pcVar10);
      if (*(long *)(in_R9 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(in_R9 + 0x18))();
      uVar14 = 5;
      if ((long *)(local_58 & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(local_58 & 0xfffffffffffffffe) + 8))();
      }
    }
    Vals_1 = (unsigned_long *)((long)OffsetPtr + 0x14);
    Vals_2 = (byte *)((long)OffsetPtr + 0x16);
    Vals_1_00 = OffsetPtr + 1;
    *(undefined1 *)OffsetPtr = 0;
    _TmpLength = this;
    local_34 = uVar14;
    if (uVar14 < 5) {
      *(ushort *)Vals_1 = uVar14;
      *Vals_2 = local_31;
      *(char *)((long)OffsetPtr + 0x17) = '\0';
      if (Data.Section == (DWARFSection *)0x0) {
        uVar9 = 0;
      }
      else {
        uVar9 = (undefined4)((Data.Section)->Data).Length;
      }
      *(undefined4 *)(OffsetPtr + 3) = uVar9;
    }
    else {
      local_50 = Vals_2;
      uVar8 = DataExtractor::getU32(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
      *(uint32_t *)(OffsetPtr + 2) = uVar8;
      if (uVar8 == 0xffffffff) {
        *(undefined4 *)(OffsetPtr + 2) = 0;
        pcVar10 = (char *)std::_V2::generic_category();
        pcVar12 = "DWARF64 is not supported in .debug_addr at offset 0x%lx";
        peVar13 = (error_category *)0x5f;
        this = _TmpLength;
        goto LAB_00d75099;
      }
      if (uVar8 < 4) {
        uVar11 = uVar8 | 4;
        if (uVar8 == 0) {
          uVar11 = 0;
        }
        local_48 = CONCAT44(local_48._4_4_,uVar11);
        *(undefined4 *)(OffsetPtr + 2) = 0;
        pcVar10 = (char *)std::_V2::generic_category();
        pDVar5 = _TmpLength;
        EC_00._M_cat = (error_category *)0x16;
        EC_00._0_8_ = _TmpLength;
        createStringError<unsigned_long,unsigned_int>
                  (EC_00,pcVar10,
                   (unsigned_long *)
                   ".debug_addr table at offset 0x%lx has too small length (0x%x) to contain a complete header"
                   ,(uint *)Vals_1_00);
        return (Error)(ErrorInfoBase *)pDVar5;
      }
      uVar2 = *Vals_1_00;
      uVar11 = uVar8 + 4;
      bVar16 = uVar2 <= uVar2 + uVar11;
      bVar4 = (uVar2 + uVar11) - 1 < Data.super_DataExtractor.Data.Length;
      local_32 = bVar4 && bVar16;
      if (bVar4 && bVar16) {
        uVar7 = DataExtractor::getU16(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
        *(uint16_t *)((long)OffsetPtr + 0x14) = uVar7;
        uVar6 = DataExtractor::getU8(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
        *(uint8_t *)((long)OffsetPtr + 0x16) = uVar6;
        uVar6 = DataExtractor::getU8(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
        *(uint8_t *)((long)OffsetPtr + 0x17) = uVar6;
        uVar8 = getDataSize((DWARFDebugAddrTable *)OffsetPtr);
        *(uint32_t *)(OffsetPtr + 3) = uVar8;
        this = _TmpLength;
      }
      else {
        local_48 = CONCAT44(local_48._4_4_,uVar11);
        *(undefined4 *)(OffsetPtr + 2) = 0;
        pcVar10 = (char *)std::_V2::generic_category();
        this = _TmpLength;
        EC_05._M_cat = (error_category *)0x16;
        EC_05._0_8_ = _TmpLength;
        createStringError<unsigned_int,unsigned_long>
                  (EC_05,pcVar10,
                   (uint *)
                   "section is not large enough to contain a .debug_addr table of length 0x%x at offset 0x%lx"
                   ,&local_48);
      }
      Vals_2 = local_50;
      if (local_32 == '\0') {
        return (Error)(ErrorInfoBase *)this;
      }
    }
    if (*(ushort *)Vals_1 < 6) {
      if (*(ushort *)Vals_1 == local_34) {
        bVar1 = *Vals_2;
        if ((bVar1 == 4) || (bVar1 == 8)) {
          if (local_31 != 0 && bVar1 != local_31) {
            pcVar10 = (char *)std::_V2::generic_category();
            EC_03._M_cat = (error_category *)0x16;
            EC_03._0_8_ = this;
            createStringError<unsigned_long,unsigned_char,unsigned_char>
                      (EC_03,pcVar10,
                       (unsigned_long *)
                       ".debug_addr table at offset 0x%lx has address size %u which is different from CU address size %u"
                       ,(uchar *)Vals_1_00,Vals_2);
            return (Error)(ErrorInfoBase *)this;
          }
          if (*(char *)((long)OffsetPtr + 0x17) == '\0') {
            uVar11 = (uint)OffsetPtr[3];
            if (uVar11 % (uint)bVar1 != 0) {
              *(undefined4 *)(OffsetPtr + 2) = 0;
              pcVar10 = (char *)std::_V2::generic_category();
              EC_07._M_cat = (error_category *)0x16;
              EC_07._0_8_ = this;
              createStringError<unsigned_long,unsigned_int,unsigned_char>
                        (EC_07,pcVar10,
                         (unsigned_long *)
                         ".debug_addr table at offset 0x%lx contains data of size %u which is not a multiple of addr size %u"
                         ,(uint *)Vals_1_00,(uchar *)(OffsetPtr + 3));
              return (Error)(ErrorInfoBase *)this;
            }
            if (bVar1 <= uVar11) {
              _TmpLength = (DWARFDebugAddrTable *)(OffsetPtr + 4);
              uVar15 = 0;
              Data.super_DataExtractor.AddressSize = bVar1;
              local_50 = Vals_2;
              do {
                if (*local_50 == 4) {
                  uVar8 = DataExtractor::getU32(&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
                  local_48 = (ulong)uVar8;
                  iVar3._M_current = (unsigned_long *)OffsetPtr[5];
                  if (iVar3._M_current == (unsigned_long *)OffsetPtr[6]) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                    _M_realloc_insert<unsigned_long>
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)_TmpLength,
                               iVar3,&local_48);
                  }
                  else {
                    *iVar3._M_current = local_48;
                    OffsetPtr[5] = (uint64_t)(iVar3._M_current + 1);
                  }
                }
                else {
                  local_48 = DataExtractor::getU64
                                       (&Data.super_DataExtractor,offset_ptr,(Error *)0x0);
                  iVar3._M_current = (unsigned_long *)OffsetPtr[5];
                  if (iVar3._M_current == (unsigned_long *)OffsetPtr[6]) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                    _M_realloc_insert<unsigned_long>
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)_TmpLength,
                               iVar3,&local_48);
                  }
                  else {
                    *iVar3._M_current = local_48;
                    OffsetPtr[5] = (uint64_t)(iVar3._M_current + 1);
                  }
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < uVar11 / bVar1);
            }
            *(_func_int ***)this = (_func_int **)0x1;
            return (Error)(ErrorInfoBase *)this;
          }
          pcVar10 = (char *)std::_V2::generic_category();
          pcVar12 = ".debug_addr table at offset 0x%lx has unsupported segment selector size %u";
        }
        else {
          pcVar10 = (char *)std::_V2::generic_category();
          pcVar12 = ".debug_addr table at offset 0x%lx has unsupported address size %u";
        }
        EC_06._M_cat = (error_category *)0x5f;
        EC_06._0_8_ = this;
        createStringError<unsigned_long,unsigned_char>
                  (EC_06,pcVar10,(unsigned_long *)pcVar12,(uchar *)Vals_1_00);
      }
      else {
        pcVar10 = (char *)std::_V2::generic_category();
        EC_04._M_cat = (error_category *)0x16;
        EC_04._0_8_ = this;
        createStringError<unsigned_long,unsigned_short,unsigned_short>
                  (EC_04,pcVar10,
                   (unsigned_long *)
                   ".debug_addr table at offset 0x%lx has version %u which is different from the version suggested by the DWARF unit header: %u"
                   ,(unsigned_short *)Vals_1_00,(unsigned_short *)Vals_1);
      }
    }
    else {
      pcVar10 = (char *)std::_V2::generic_category();
      EC_02._M_cat = (error_category *)0x5f;
      EC_02._0_8_ = this;
      createStringError<unsigned_short,unsigned_long>
                (EC_02,pcVar10,
                 (unsigned_short *)
                 "version %u of .debug_addr section at offset 0x%lx is not supported",Vals_1);
    }
  }
  else {
    pcVar10 = (char *)std::_V2::generic_category();
    pcVar12 = "section is not large enough to contain a .debug_addr table length at offset 0x%lx";
    peVar13 = (error_category *)0x16;
LAB_00d75099:
    EC_01._M_cat = peVar13;
    EC_01._0_8_ = this;
    createStringError<unsigned_long>(EC_01,pcVar10,(unsigned_long *)pcVar12);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFDebugAddrTable::extract(DWARFDataExtractor Data,
                                   uint64_t *OffsetPtr,
                                   uint16_t Version,
                                   uint8_t AddrSize,
                                   std::function<void(Error)> WarnCallback) {
  clear();
  HeaderOffset = *OffsetPtr;
  // Read and verify the length field.
  if (!Data.isValidOffsetForDataOfSize(*OffsetPtr, sizeof(uint32_t)))
    return createStringError(errc::invalid_argument,
                       "section is not large enough to contain a "
                       ".debug_addr table length at offset 0x%"
                       PRIx64, *OffsetPtr);
  uint16_t UnitVersion;
  if (Version == 0) {
    WarnCallback(createStringError(errc::invalid_argument,
                       "DWARF version is not defined in CU,"
                       " assuming version 5"));
    UnitVersion = 5;
  } else {
    UnitVersion = Version;
  }
  // TODO: Add support for DWARF64.
  Format = dwarf::DwarfFormat::DWARF32;
  if (UnitVersion >= 5) {
    HeaderData.Length = Data.getU32(OffsetPtr);
    if (HeaderData.Length == dwarf::DW_LENGTH_DWARF64) {
      invalidateLength();
      return createStringError(errc::not_supported,
          "DWARF64 is not supported in .debug_addr at offset 0x%" PRIx64,
          HeaderOffset);
    }
    if (HeaderData.Length + sizeof(uint32_t) < sizeof(Header)) {
      uint32_t TmpLength = getLength();
      invalidateLength();
      return createStringError(errc::invalid_argument,
                         ".debug_addr table at offset 0x%" PRIx64
                         " has too small length (0x%" PRIx32
                         ") to contain a complete header",
                         HeaderOffset, TmpLength);
    }
    uint64_t End = HeaderOffset + getLength();
    if (!Data.isValidOffsetForDataOfSize(HeaderOffset, End - HeaderOffset)) {
      uint32_t TmpLength = getLength();
      invalidateLength();
      return createStringError(errc::invalid_argument,
          "section is not large enough to contain a .debug_addr table "
          "of length 0x%" PRIx32 " at offset 0x%" PRIx64,
          TmpLength, HeaderOffset);
    }

    HeaderData.Version = Data.getU16(OffsetPtr);
    HeaderData.AddrSize = Data.getU8(OffsetPtr);
    HeaderData.SegSize = Data.getU8(OffsetPtr);
    DataSize = getDataSize();
  } else {
    HeaderData.Version = UnitVersion;
    HeaderData.AddrSize = AddrSize;
    // TODO: Support for non-zero SegSize.
    HeaderData.SegSize = 0;
    DataSize = Data.size();
  }

  // Perform basic validation of the remaining header fields.

  // We support DWARF version 5 for now as well as pre-DWARF5
  // implementations of .debug_addr table, which doesn't contain a header
  // and consists only of a series of addresses.
  if (HeaderData.Version > 5) {
    return createStringError(errc::not_supported, "version %" PRIu16
        " of .debug_addr section at offset 0x%" PRIx64 " is not supported",
        HeaderData.Version, HeaderOffset);
  }
  // FIXME: For now we just treat version mismatch as an error,
  // however the correct way to associate a .debug_addr table
  // with a .debug_info table is to look at the DW_AT_addr_base
  // attribute in the info table.
  if (HeaderData.Version != UnitVersion)
    return createStringError(errc::invalid_argument,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has version %" PRIu16
                       " which is different from the version suggested"
                       " by the DWARF unit header: %" PRIu16,
                       HeaderOffset, HeaderData.Version, UnitVersion);
  if (HeaderData.AddrSize != 4 && HeaderData.AddrSize != 8)
    return createStringError(errc::not_supported,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has unsupported address size %" PRIu8,
                       HeaderOffset, HeaderData.AddrSize);
  if (HeaderData.AddrSize != AddrSize && AddrSize != 0)
    return createStringError(errc::invalid_argument,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has address size %" PRIu8
                       " which is different from CU address size %" PRIu8,
                       HeaderOffset, HeaderData.AddrSize, AddrSize);

  // TODO: add support for non-zero segment selector size.
  if (HeaderData.SegSize != 0)
    return createStringError(errc::not_supported,
                       ".debug_addr table at offset 0x%" PRIx64
                       " has unsupported segment selector size %" PRIu8,
                       HeaderOffset, HeaderData.SegSize);
  if (DataSize % HeaderData.AddrSize != 0) {
    invalidateLength();
    return createStringError(errc::invalid_argument,
                       ".debug_addr table at offset 0x%" PRIx64
                       " contains data of size %" PRIu32
                       " which is not a multiple of addr size %" PRIu8,
                       HeaderOffset, DataSize, HeaderData.AddrSize);
  }
  Data.setAddressSize(HeaderData.AddrSize);
  uint32_t AddrCount = DataSize / HeaderData.AddrSize;
  for (uint32_t I = 0; I < AddrCount; ++I)
    if (HeaderData.AddrSize == 4)
      Addrs.push_back(Data.getU32(OffsetPtr));
    else
      Addrs.push_back(Data.getU64(OffsetPtr));
  return Error::success();
}